

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cpp
# Opt level: O0

bool asl::Directory::create(String *name)

{
  bool bVar1;
  String *s;
  byte local_fb;
  Directory local_e0;
  Directory local_c0;
  String local_a0;
  Path local_88;
  undefined1 local_70 [8];
  String parent;
  Path local_48;
  undefined1 local_30 [8];
  Path path;
  String *name_local;
  
  path._path.field_2._8_8_ = name;
  bVar1 = asl::String::ok(name);
  if (bVar1) {
    bVar1 = createOne((String *)path._path.field_2._8_8_);
    if (bVar1) {
      name_local._7_1_ = true;
    }
    else {
      Path::Path(&local_48,(String *)path._path.field_2._8_8_);
      Path::absolute((Path *)local_30,&local_48);
      Path::~Path(&local_48);
      Path::directory(&local_88,(Path *)local_30);
      s = Path::operator_cast_to_String_(&local_88);
      asl::String::String((String *)local_70,s);
      Path::~Path(&local_88);
      Directory(&local_c0,(String *)local_70);
      directory(&local_a0,&local_c0);
      bVar1 = asl::String::ok(&local_a0);
      asl::String::~String(&local_a0);
      ~Directory(&local_c0);
      if (bVar1) {
        bVar1 = asl::String::ok((String *)local_70);
        local_fb = 0;
        if (bVar1) {
          Directory(&local_e0,(String *)local_70);
          bVar1 = exists(&local_e0);
          local_fb = bVar1 ^ 0xff;
          ~Directory(&local_e0);
        }
        if ((local_fb & 1) != 0) {
          create((String *)local_70);
        }
      }
      name_local._7_1_ = createOne((String *)path._path.field_2._8_8_);
      asl::String::~String((String *)local_70);
      Path::~Path((Path *)local_30);
    }
  }
  else {
    name_local._7_1_ = false;
  }
  return name_local._7_1_;
}

Assistant:

bool Directory::create(const String& name)
{
	if (!name.ok())
		return false;
	if (createOne(name))
		return true;
	Path path = Path(name).absolute();
	String parent = path.directory();
	if (Directory(parent).directory().ok())
	if (parent.ok() && !Directory(parent).exists())
	{
		create(parent);
	}
	
	return createOne(name);
}